

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::Regexp::~Regexp(Regexp *this)

{
  uint8_t uVar1;
  string *this_00;
  LogMessage LStack_188;
  
  if (this->nsub_ != 0) {
    LogMessage::LogMessage
              (&LStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/regexp.cc"
               ,0x2f);
    std::operator<<((ostream *)&LStack_188.str_,"Regexp not destroyed.");
    LogMessage::~LogMessage(&LStack_188);
  }
  uVar1 = this->op_;
  if (uVar1 == '\x04') {
    if ((this->field_7).the_union_[1] != (void *)0x0) {
      operator_delete__((this->field_7).the_union_[1]);
    }
  }
  else {
    if (uVar1 == '\x14') {
      if ((this->field_7).the_union_[0] != (void *)0x0) {
        operator_delete__((this->field_7).the_union_[0]);
      }
      this_00 = (string *)(this->field_7).the_union_[1];
      if (this_00 != (string *)0x0) {
        std::
        _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
        ::~_Rb_tree((_Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                     *)&this_00->field_2);
      }
    }
    else {
      if (uVar1 != '\v') {
        return;
      }
      this_00 = (this->field_7).field_1.name_;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete name_;
      break;
    case kRegexpLiteralString:
      delete[] runes_;
      break;
    case kRegexpCharClass:
      if (cc_)
        cc_->Delete();
      delete ccb_;
      break;
  }
}